

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * __thiscall
mjs::interpreter::impl::get_value(value *__return_storage_ptr__,impl *this,value *v)

{
  undefined8 *puVar1;
  uint *puVar2;
  wostream *pwVar3;
  native_error_exception *this_00;
  wstring_view *s;
  object_ptr b;
  wostringstream woss;
  gc_heap_ptr_untyped local_208;
  wstring local_1f8;
  wchar_t *local_1d8;
  uint *local_1d0;
  wstring_view local_1b8;
  wstring_view local_1a8;
  ulong local_198;
  uint *local_190;
  
  if (v->type_ == reference) {
    local_208.heap_ =
         (v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_208.pos_ = *(uint32_t *)((long)&v->field_1 + 8);
    if (local_208.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_208.heap_,&local_208);
    }
    if (local_208.heap_ == (gc_heap *)0x0) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&local_198);
      puVar2 = (uint *)gc_heap_ptr_untyped::get
                                 ((gc_heap_ptr_untyped *)&(v->field_1).r_.property_name_);
      local_1d0 = puVar2 + 1;
      local_1d8 = (wchar_t *)(ulong)*puVar2;
      cpp_quote_abi_cxx11_(&local_1f8,(mjs *)&local_1d8,s);
      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         ((wostream *)&local_198,local_1f8._M_dataplus._M_p,
                          local_1f8._M_string_length);
      std::operator<<(pwVar3," is not defined");
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity * 4 + 4);
      }
      this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_1f8,this);
      local_1b8._M_len = local_1f8._M_string_length;
      local_1b8._M_str = local_1f8._M_dataplus._M_p;
      std::__cxx11::wstringbuf::str();
      local_1a8._M_len = (size_t)local_1d0;
      local_1a8._M_str = local_1d8;
      native_error_exception::native_error_exception(this_00,reference,&local_1b8,&local_1a8);
      __cxa_throw(this_00,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    puVar1 = (undefined8 *)gc_heap_ptr_untyped::get(&local_208);
    puVar2 = (uint *)gc_heap_ptr_untyped::get
                               ((gc_heap_ptr_untyped *)&(v->field_1).r_.property_name_);
    local_190 = puVar2 + 1;
    local_198 = (ulong)*puVar2;
    (**(code **)*puVar1)(__return_storage_ptr__,puVar1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_208);
  }
  else {
    value::value(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

value get_value(const value& v) const {
        if (v.type() != value_type::reference) {
            return v;
        }
        auto& r = v.reference_value();
        auto b = r.base();
        if (!b) {
            std::wostringstream woss;
            woss << cpp_quote(r.property_name().view()) << " is not defined";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }
        return b->get(r.property_name().view());
    }